

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator *this,cmGlobalGenerator *gen)

{
  string *a;
  string local_30;
  
  if ((gen->ConfiguredFilesPath)._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->ConfiguredFilesPath);
    return;
  }
  a = cmake::GetHomeOutputDirectory_abi_cxx11_(gen->CMakeInstance);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[12]>(&local_30,a,(char (*) [12])"/CMakeFiles");
  std::__cxx11::string::operator=((string *)&this->ConfiguredFilesPath,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator* gen)
{
  if (!gen->ConfiguredFilesPath.empty()) {
    this->ConfiguredFilesPath = gen->ConfiguredFilesPath;
  } else {
    this->ConfiguredFilesPath =
      cmStrCat(gen->CMakeInstance->GetHomeOutputDirectory(), "/CMakeFiles");
  }
}